

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverADMM.cpp
# Opt level: O2

double __thiscall chrono::ChSolverADMM::_SolveFast(ChSolverADMM *this,ChSystemDescriptor *sysd)

{
  double *val;
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pointer ppCVar6;
  ChConstraint *pCVar7;
  StorageIndex *pSVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  bool bVar12;
  int iVar13;
  AdmmStepType AVar14;
  Scalar *pSVar15;
  Scalar *pSVar16;
  ChLog *pCVar17;
  ChStreamOutAscii *pCVar18;
  _func_int **pp_Var19;
  ulong uVar20;
  uint uVar21;
  int i;
  uint uVar22;
  long lVar23;
  Scalar SVar24;
  RealScalar RVar30;
  undefined1 auVar31 [16];
  RealScalar RVar25;
  RealScalar RVar26;
  RealScalar RVar27;
  RealScalar RVar28;
  RealScalar mdeltalambda;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  LhsNested pSVar29;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int nc;
  int nv;
  double local_478;
  ChVectorDynamic<> l;
  double local_458;
  ChVectorDynamic<> y;
  ChVectorDynamic<> vrho;
  ChVectorDynamic<> z;
  ChVectorDynamic<> S;
  StorageIndex *local_408;
  ChVectorDynamic<> v;
  double rho_i;
  ChVectorDynamic<> l_old;
  ChVectorDynamic<> b;
  double local_3b8;
  Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> local_3b0;
  ChVectorDynamic<> y_old;
  ChVectorDynamic<> B;
  ChVectorDynamic<> IS;
  undefined1 local_348 [24];
  scalar_constant_op<double> sStack_330;
  variable_if_dynamic<long,__1> vStack_328;
  variable_if_dynamic<long,__1> vStack_320;
  Scalar *pSStack_318;
  ChSparseMatrix H;
  ChVectorDynamic<> ckkt;
  ChVectorDynamic<> vsigma;
  ChVectorDynamic<> v_old;
  ChVectorDynamic<> k;
  ChTimer<double> m_timer_convert;
  ChVectorDynamic<> z_old;
  ChTimer<double> m_timer_solve;
  ChTimer<double> m_timer_factorize;
  ChSparseMatrix Cq;
  ChSparsityPatternLearner sparsity_pattern;
  ChVectorDynamic<> *local_e0 [2];
  ChSparseMatrix A;
  ChSparseMatrix E;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  m_timer_convert.m_start.__d.__r = (duration)0;
  m_timer_convert.m_end.__d.__r = (duration)0;
  m_timer_factorize.m_start.__d.__r = (duration)0;
  m_timer_factorize.m_end.__d.__r = (duration)0;
  m_timer_solve.m_start.__d.__r = (duration)0;
  m_timer_solve.m_end.__d.__r = (duration)0;
  rho_i = this->rho;
  iVar13 = (*sysd->_vptr_ChSystemDescriptor[8])(sysd);
  nc = iVar13;
  nv = (*sysd->_vptr_ChSystemDescriptor[7])(sysd);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&v,&nv);
  if (iVar13 == 0) {
    Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&H,(long)nv,(long)nv);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>((Matrix<double,__1,_1,_0,__1,_1> *)&Cq,&nv);
    m_timer_convert.m_start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    ChSparsityPatternLearner::ChSparsityPatternLearner(&sparsity_pattern,nv,nv);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&sparsity_pattern,0);
    ChSparsityPatternLearner::Apply(&sparsity_pattern,&H);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&H,&Cq);
    Eigen::SparseMatrix<double,_1,_int>::operator=
              (&((this->LS_solver).
                 super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_mat,&H);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&((this->LS_solver).
                 super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_rhs,(Matrix<double,__1,_1,_0,__1,_1> *)&Cq);
    ChTimer<double>::stop(&m_timer_convert);
    if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
      pCVar17 = GetLog();
      pCVar18 = ChStreamOutAscii::operator<<
                          (&pCVar17->super_ChStreamOutAscii," Time for ConvertToMatrixForm: << ");
      dVar44 = ChTimer<double>::GetTimeSecondsIntermediate(&m_timer_convert);
      pCVar18 = ChStreamOutAscii::operator<<(pCVar18,dVar44);
      ChStreamOutAscii::operator<<(pCVar18,"s\n");
    }
    (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[10])();
    (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xb])();
    (*sysd->_vptr_ChSystemDescriptor[0x11])
              (sysd,&((this->LS_solver).
                      super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_sol);
    ChSparsityPatternLearner::~ChSparsityPatternLearner(&sparsity_pattern);
    Eigen::internal::handmade_aligned_free(Cq._vptr_SparseMatrix);
    Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix(&H);
    local_458 = 0.0;
  }
  else {
    Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&Cq,(long)iVar13,(long)nv);
    Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&E,(long)nc,(long)nc);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&k,&nv);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&b,&nc);
    Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&A,(long)nc + (long)nv,(long)nc + (long)nv);
    sparsity_pattern.super_SparseMatrix<double,_1,_int>._vptr_SparseMatrix =
         (_func_int **)
         CONCAT44(sparsity_pattern.super_SparseMatrix<double,_1,_int>._vptr_SparseMatrix._4_4_,
                  nc + nv);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&B,(int *)&sparsity_pattern);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&l,&nc);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&z,&nc);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&y,&nc);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&l_old,&nc);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&z_old,&nc);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&y_old,&nc);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&v_old,&nv);
    (*sysd->_vptr_ChSystemDescriptor[0x1b])(sysd,&Cq,0,&E,&k,&b,0,0,0);
    Eigen::SparseMatrix<double,_1,_int>::makeCompressed(&Cq);
    Eigen::SparseMatrix<double,_1,_int>::makeCompressed(&E);
    if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == false) {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&l);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&z);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&y);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&v);
    }
    else {
      (*sysd->_vptr_ChSystemDescriptor[0x12])(sysd,&l,0);
      (*sysd->_vptr_ChSystemDescriptor[0x10])(sysd,&v,0);
      IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage =
           (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
           Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,1,int>>::operator*
                     ((SparseMatrixBase<Eigen::SparseMatrix<double,1,int>> *)
                      &Cq.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>,
                      (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&v);
      local_3b0 = Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,1,int>>::operator*
                            ((SparseMatrixBase<Eigen::SparseMatrix<double,1,int>> *)
                             &E.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>,
                             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&l);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,-1,1,0,-1,1>,0>>
      ::operator-((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                   *)local_348,
                  (MatrixBase<Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                   *)&IS,(MatrixBase<Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                          *)&local_3b0);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const>>
      ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)&H,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
                         *)local_348,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&b);
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_outerSize = H._8_8_;
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_innerSize = H.m_outerSize;
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_outerIndex =
           (StorageIndex *)H.m_innerSize;
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_innerNonZeros = H.m_outerIndex;
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_data.m_indices =
           (StorageIndex *)H.m_data.m_values;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                (&y,(CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)&sparsity_pattern);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(&z,&l);
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&S,&nc);
    if (this->precond == true) {
      uVar22 = 0;
      while( true ) {
        ppCVar6 = (sysd->vconstraints).
                  super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar20 = (long)(sysd->vconstraints).
                       super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6 >> 3;
        if (uVar20 <= uVar22) break;
        (*ppCVar6[uVar22]->_vptr_ChConstraint[6])();
        uVar22 = uVar22 + 1;
      }
      iVar13 = 0;
      uVar22 = 0xffffffff;
      while( true ) {
        uVar21 = uVar22;
        uVar22 = uVar21 + 1;
        if (uVar20 <= uVar22) break;
        pCVar7 = ppCVar6[uVar22];
        if (pCVar7->mode == CONSTRAINT_FRIC) {
          local_e0[(long)iVar13 + -0x11] = (ChVectorDynamic<> *)pCVar7->g_i;
          iVar13 = iVar13 + 1;
          if (iVar13 == 3) {
            dVar44 = ((double)sparsity_pattern.super_SparseMatrix<double,_1,_int>._vptr_SparseMatrix
                      + (double)sparsity_pattern.super_SparseMatrix<double,_1,_int>._8_8_ +
                     (double)sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_outerSize) / 3.0;
            ppCVar6[uVar21 - 1]->g_i = dVar44;
            iVar13 = 0;
            ppCVar6[uVar21]->g_i = dVar44;
            pCVar7->g_i = dVar44;
          }
        }
      }
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      iVar13 = 0;
      uVar22 = 0;
      while( true ) {
        ppCVar6 = (sysd->vconstraints).
                  super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(sysd->vconstraints).
                          super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6 >> 3) <=
            (ulong)uVar22) break;
        pCVar7 = ppCVar6[uVar22];
        if (pCVar7->active == true) {
          dVar44 = pCVar7->g_i;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = dVar44;
          if (dVar44 < 0.0) {
            SVar24 = sqrt(dVar44);
          }
          else {
            auVar35 = vsqrtsd_avx(auVar31,auVar31);
            SVar24 = auVar35._0_8_;
          }
          pSVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&S,
                               (long)iVar13,0);
          iVar13 = iVar13 + 1;
          *pSVar15 = SVar24;
        }
        uVar22 = uVar22 + 1;
      }
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&b,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                (&b,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)&H);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      cwiseQuotient<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&l,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                (&l,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)&H);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      cwiseQuotient<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&z,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                (&z,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)&H);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&y,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                (&y,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)&H);
    }
    else {
      sparsity_pattern.super_SparseMatrix<double,_1,_int>._vptr_SparseMatrix =
           (_func_int **)&DAT_3ff0000000000000;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S,
                 (Scalar *)&sparsity_pattern);
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&vsigma,&nc);
    val = &this->sigma;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vsigma,val);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&vrho,&nc);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vrho,&rho_i);
    iVar13 = 0;
    uVar22 = 0;
    while( true ) {
      ppCVar6 = (sysd->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(sysd->vconstraints).
                        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6 >> 3) <=
          (ulong)uVar22) break;
      pCVar7 = ppCVar6[uVar22];
      if (pCVar7->active == true) {
        if (pCVar7->mode == CONSTRAINT_LOCK) {
          local_478 = this->rho_b;
          pSVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&vrho,
                               (long)iVar13);
          *pSVar15 = local_478;
        }
        iVar13 = iVar13 + 1;
      }
      uVar22 = uVar22 + 1;
    }
    m_timer_convert.m_start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    Eigen::SparseMatrix<double,_1,_int>::resize
              (&((this->LS_solver).
                 super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_mat,(long)nc + (long)nv,(long)nc + (long)nv);
    ChSparsityPatternLearner::ChSparsityPatternLearner(&sparsity_pattern,nc + nv,nc + nv);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&sparsity_pattern,0);
    ChSparsityPatternLearner::Apply(&sparsity_pattern,&A);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&A,&B);
    if (this->precond == true) {
      H._vptr_SparseMatrix._0_4_ = nc + nv;
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&IS,(int *)&H);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Ones
                ((ConstantReturnType *)local_348,(long)nv);
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::
      CommaInitializer<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&H,
                 (Matrix<double,__1,_1,_0,__1,_1> *)&IS,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_348);
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&H,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
                ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&H);
      local_3b0.m_lhs = (LhsNested)&IS;
      Eigen::
      Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::SparseMatrix<double,_1,_int>,_0>
      ::Product((Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::SparseMatrix<double,_1,_int>,_0>
                 *)local_348,(Lhs *)&local_3b0,&A);
      ckkt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)&IS;
      Eigen::
      Product<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::SparseMatrix<double,_1,_int>,_0>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_0>
      ::Product((Product<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::SparseMatrix<double,_1,_int>,_0>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
                 *)&H,(Lhs *)local_348,(Rhs *)&ckkt);
      Eigen::SparseMatrix<double,1,int>::operator=
                ((SparseMatrix<double,1,int> *)&A,
                 (SparseMatrixBase<Eigen::Product<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::SparseMatrix<double,_1,_int>,_0>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                  *)&H);
      local_348._0_8_ = (LhsNested)&IS;
      H._0_16_ = Eigen::DiagonalBase<Eigen::DiagonalWrapper<Eigen::Matrix<double,-1,1,0,-1,1>const>>
                 ::operator*((DiagonalBase<Eigen::DiagonalWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>>
                              *)local_348,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&B)
      ;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::DiagonalWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,1>>
                (&B,(Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                     *)&H);
      Eigen::internal::handmade_aligned_free
                (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
    }
    Eigen::SparseMatrix<double,_1,_int>::operator=
              (&((this->LS_solver).
                 super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_mat,&A);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&((this->LS_solver).
                 super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_rhs,&B);
    for (lVar23 = 0; lVar23 < nc; lVar23 = lVar23 + 1) {
      local_478 = *val;
      pSVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&vrho,
                           lVar23);
      dVar44 = *pSVar15;
      pSVar16 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                          (&((this->LS_solver).
                             super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_mat,nv + lVar23,nv + lVar23);
      *pSVar16 = *pSVar16 - (dVar44 + local_478);
    }
    ChTimer<double>::stop(&m_timer_convert);
    if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
      pCVar17 = GetLog();
      pCVar18 = ChStreamOutAscii::operator<<
                          (&pCVar17->super_ChStreamOutAscii," Time for ConvertToMatrixForm: << ");
      dVar44 = ChTimer<double>::GetTimeSecondsIntermediate(&m_timer_convert);
      pCVar18 = ChStreamOutAscii::operator<<(pCVar18,dVar44);
      ChStreamOutAscii::operator<<(pCVar18,"s\n");
    }
    m_timer_factorize.m_start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[10])();
    ChTimer<double>::stop(&m_timer_factorize);
    if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
      pCVar17 = GetLog();
      pCVar18 = ChStreamOutAscii::operator<<
                          (&pCVar17->super_ChStreamOutAscii," Time for factorize : << ");
      dVar44 = ChTimer<double>::GetTimeSecondsIntermediate(&m_timer_factorize);
      pCVar18 = ChStreamOutAscii::operator<<(pCVar18,dVar44);
      ChStreamOutAscii::operator<<(pCVar18,"s\n");
    }
    uVar22 = 0;
    local_3b8 = 10000000000.0;
    local_408 = (StorageIndex *)&DAT_3ff0000000000000;
    do {
      if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations <= (int)uVar22)
      break;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&l_old,&l);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&z_old,&z);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&y_old,&y);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&v_old,&v);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      cwiseQuotient<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)local_348,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&y,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vrho);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
                ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&l,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_348);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                (&z,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)&H);
      (*sysd->_vptr_ChSystemDescriptor[0x18])(sysd,&z);
      local_e0[0] = &b;
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
                ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&local_3b0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&vsigma,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vrho);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
      ::cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&IS,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         *)&local_3b0,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&z);
      Eigen::
      MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>
      ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)local_348,
                  (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                   *)local_e0,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)&IS);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
      ::operator-((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)&H,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                         *)local_348,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&y);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&ckkt,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&H);
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::
      CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&H,
                 &((this->LS_solver).
                   super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->m_rhs,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&k);
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&H,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&ckkt);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
                ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&H);
      m_timer_solve.m_start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xb])();
      ChTimer<double>::stop(&m_timer_solve);
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
        pCVar17 = GetLog();
        pCVar18 = ChStreamOutAscii::operator<<
                            (&pCVar17->super_ChStreamOutAscii," Time for solve : << ");
        dVar44 = ChTimer<double>::GetTimeSecondsIntermediate(&m_timer_solve);
        pCVar18 = ChStreamOutAscii::operator<<(pCVar18,dVar44);
        ChStreamOutAscii::operator<<(pCVar18,"s\n");
      }
      Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<int,int>
                ((Type *)local_348,
                 (DenseBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                 &((this->LS_solver).
                   super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->m_sol,(long)nv,0,nc,1);
      H.m_outerIndex = (StorageIndex *)vStack_328.m_value;
      H.m_innerNonZeros = (StorageIndex *)vStack_320.m_value;
      H.m_data.m_values = pSStack_318;
      H._8_8_ = local_348._8_8_;
      H._vptr_SparseMatrix = (_func_int **)local_348._0_8_;
      H.m_outerSize = local_348._16_8_;
      H.m_innerSize = (Index)sStack_330.m_other;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,_1,false>const>>
                (&l,(CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>_>
                     *)&H);
      Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<int,int>
                ((Type *)&H,
                 (DenseBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                 &((this->LS_solver).
                   super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->m_sol,0,0,nv,1);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,_1,false>>
                (&v,(Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false> *)&H);
      local_3b0.m_lhs = (LhsNested)&vrho;
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&IS,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&l,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&z);
      Eigen::
      Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_1>
      ::Product((Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1>
                 *)local_348,(Lhs *)&local_3b0,(Rhs *)&IS);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
                ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1>_>
                  *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&y,
                 (MatrixBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1>_>
                  *)local_348);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::DiagonalWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,1>const>>
                (&y,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1>_>
                     *)&H);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)local_348,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&z,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&l);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
      ::cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&H,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                        *)local_348,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      RVar25 = Eigen::internal::
               lpNorm_selector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_-1>
               ::run((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&H);
      this->r_prim = RVar25;
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&z,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&l);
      RVar26 = Eigen::internal::
               lpNorm_selector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_-1>
               ::run((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&H);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&IS,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&l,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&l_old);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
      ::cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)local_348,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                  *)&IS,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vrho);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
      ::cwiseQuotient<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&H,local_348,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      RVar27 = Eigen::internal::
               lpNorm_selector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_-1>
               ::run((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&H);
      this->r_dual = RVar27;
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)local_348,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&l,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&l_old);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
      ::cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&H,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                        *)local_348,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vrho);
      RVar25 = Eigen::internal::
               lpNorm_selector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_-1>
               ::run((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&H);
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
        pCVar17 = GetLog();
        pCVar18 = ChStreamOutAscii::operator<<(&pCVar17->super_ChStreamOutAscii,"ADMMfast iter=");
        pCVar18 = ChStreamOutAscii::operator<<(pCVar18,uVar22);
        pCVar18 = ChStreamOutAscii::operator<<(pCVar18," prim=");
        pCVar18 = ChStreamOutAscii::operator<<(pCVar18,this->r_prim);
        pCVar18 = ChStreamOutAscii::operator<<(pCVar18," dual=");
        pCVar18 = ChStreamOutAscii::operator<<(pCVar18,this->r_dual);
        pCVar18 = ChStreamOutAscii::operator<<(pCVar18,"  rho=");
        pCVar18 = ChStreamOutAscii::operator<<(pCVar18,rho_i);
        pCVar18 = ChStreamOutAscii::operator<<(pCVar18," alpha=");
        pCVar18 = ChStreamOutAscii::operator<<(pCVar18,(double)local_408);
        pCVar18 = ChStreamOutAscii::operator<<(pCVar18,"  tols=");
        pCVar18 = ChStreamOutAscii::operator<<(pCVar18,this->tol_prim);
        pCVar18 = ChStreamOutAscii::operator<<(pCVar18," ");
        pCVar18 = ChStreamOutAscii::operator<<(pCVar18,this->tol_dual);
        ChStreamOutAscii::operator<<(pCVar18,"\n");
      }
      if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
        local_478 = 1.0 / this->rho;
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                  ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&y,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&y_old);
        auVar32._0_8_ =
             Eigen::
             MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)&H);
        dVar44 = this->rho;
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                  ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_348,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&l,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&l_old);
        RVar28 = Eigen::
                 MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                 ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_348);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                  ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&l,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&l_old);
        mdeltalambda = Eigen::
                       MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                       ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)&H);
        auVar32._8_8_ = 0;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = local_478;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = RVar28 * dVar44;
        auVar35 = vfmadd132sd_fma(auVar32,auVar47,auVar35);
        ChIterativeSolverVI::AtIterationEnd
                  (&this->super_ChIterativeSolverVI,auVar35._0_8_,mdeltalambda,uVar22);
      }
      if ((this->tol_prim <= this->r_prim) || (this->tol_dual <= this->r_dual)) {
        if (1 < uVar22) {
          dVar44 = this->rho;
          Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                    ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&y,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&y_old);
          local_478 = Eigen::
                      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                      ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              *)&H);
          dVar1 = this->rho;
          Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                    ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_348,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&l,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&l_old);
          RVar28 = Eigen::
                   MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                   ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)local_348);
          auVar45._8_8_ = 0;
          auVar45._0_8_ = local_478;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = 1.0 / dVar44;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = RVar28 * dVar1;
          auVar35 = vfmadd132sd_fma(auVar45,auVar33,auVar4);
          local_478 = auVar35._0_8_;
          if (local_3b8 * 0.9999 <= local_478) {
            if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
              pCVar17 = GetLog();
              pCVar18 = ChStreamOutAscii::operator<<
                                  (&pCVar17->super_ChStreamOutAscii,"ADMMfast Nesterov restart.");
              pCVar18 = ChStreamOutAscii::operator<<(pCVar18,uVar22);
              ChStreamOutAscii::operator<<(pCVar18,"\n");
            }
            local_3b8 = local_478 * 1.000100010001;
            local_408 = (StorageIndex *)&DAT_3ff0000000000000;
          }
          else {
            auVar34._8_8_ = 0;
            auVar34._0_8_ = (double)local_408 * (double)local_408;
            auVar35 = vfmadd213sd_fma(auVar34,ZEXT816(0x4010000000000000),
                                      ZEXT816(0x3ff0000000000000));
            if (auVar35._0_8_ < 0.0) {
              dVar44 = sqrt(auVar35._0_8_);
            }
            else {
              auVar35 = vsqrtsd_avx(auVar35,auVar35);
              dVar44 = auVar35._0_8_;
            }
            pSVar8 = (StorageIndex *)((dVar44 + 1.0) * 0.5);
            pSVar29 = (LhsNested)(((double)local_408 + -1.0) / (double)pSVar8);
            local_3b0.m_lhs = pSVar29;
            Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                      ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)&IS,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&l,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&l_old);
            Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              *)local_348,(double *)&local_3b0,(StorageBaseType *)&IS);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
                      ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                        *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&l,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                        *)local_348);
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>>
                      (&l,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                           *)&H);
            local_3b0.m_lhs = pSVar29;
            Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                      ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)&IS,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&v,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&v_old);
            Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              *)local_348,(double *)&local_3b0,(StorageBaseType *)&IS);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
                      ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                        *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&v,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                        *)local_348);
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>>
                      (&v,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                           *)&H);
            local_3b0.m_lhs = pSVar29;
            Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                      ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)&IS,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&y,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&y_old);
            Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              *)local_348,(double *)&local_3b0,(StorageBaseType *)&IS);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
                      ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                        *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&y,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                        *)local_348);
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>>
                      (&y,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                           *)&H);
            local_408 = pSVar8;
            local_3b8 = local_478;
          }
        }
        bVar12 = true;
        bVar11 = true;
        if ((int)uVar22 % this->stepadjust_each == 0) {
          auVar35 = ZEXT816(0x3ff0000000000000);
          AVar14 = this->stepadjust_type;
          if (AVar14 == BALANCED_UNSCALED) {
            auVar36._0_8_ = RVar26 / RVar25;
            auVar36._8_8_ = extraout_XMM0_Qb;
            if (auVar36._0_8_ < 0.0) {
              auVar40._0_8_ = sqrt(auVar36._0_8_);
              auVar40._8_56_ = extraout_var;
              auVar35 = auVar40._0_16_;
            }
            else {
              auVar35 = vsqrtsd_avx(auVar36,auVar36);
            }
            AVar14 = this->stepadjust_type;
          }
          if (AVar14 == BALANCED_FAST) {
            local_478 = Eigen::internal::lpNorm_selector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>
                        ::run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&z);
            RVar30 = Eigen::internal::lpNorm_selector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::
                     run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&l);
            auVar41._0_8_ =
                 Eigen::internal::lpNorm_selector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::run
                           ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&y);
            auVar41._8_56_ = extraout_var_00;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = local_478;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = RVar30;
            auVar35 = vmaxsd_avx(auVar46,auVar5);
            auVar35 = vunpcklpd_avx(auVar35,auVar41._0_16_);
            auVar37._0_8_ = auVar35._0_8_ + 1e-10;
            auVar37._8_8_ = auVar35._8_8_ + 1e-10;
            auVar9._8_8_ = extraout_XMM0_Qb;
            auVar9._0_8_ = RVar26;
            auVar10._8_8_ = extraout_XMM0_Qb_00;
            auVar10._0_8_ = RVar25;
            auVar35 = vunpcklpd_avx(auVar9,auVar10);
            auVar35 = vdivpd_avx(auVar35,auVar37);
            auVar32 = vshufpd_avx(auVar35,auVar35,1);
            auVar38._0_8_ = auVar35._0_8_ / (auVar32._0_8_ + 1e-10);
            auVar38._8_8_ = auVar35._8_8_;
            if (auVar38._0_8_ < 0.0) {
              auVar42._0_8_ = sqrt(auVar38._0_8_);
              auVar42._8_56_ = extraout_var_01;
              auVar35 = auVar42._0_16_;
            }
            else {
              auVar35 = vsqrtsd_avx(auVar38,auVar38);
            }
            AVar14 = this->stepadjust_type;
          }
          if (AVar14 == BALANCED_RANGE) {
            auVar2._0_8_ = this->r_prim;
            auVar2._8_8_ = this->r_dual;
            auVar3._0_8_ = this->tol_prim;
            auVar3._8_8_ = this->tol_dual;
            auVar35 = vdivpd_avx(auVar2,auVar3);
            auVar32 = vshufpd_avx(auVar35,auVar35,1);
            auVar39._0_8_ = auVar35._0_8_ / (auVar32._0_8_ + 1e-10);
            auVar39._8_8_ = auVar35._8_8_;
            if (auVar39._0_8_ < 0.0) {
              auVar43._0_8_ = sqrt(auVar39._0_8_);
              auVar43._8_56_ = extraout_var_02;
              auVar35 = auVar43._0_16_;
            }
            else {
              auVar35 = vsqrtsd_avx(auVar39,auVar39);
            }
          }
          auVar48._8_8_ = 0;
          auVar48._0_8_ = this->stepadjust_maxfactor;
          auVar49._0_8_ = 1.0 / this->stepadjust_maxfactor;
          auVar49._8_8_ = 0;
          auVar35 = vmaxsd_avx(auVar49,auVar35);
          auVar35 = vminsd_avx(auVar48,auVar35);
          dVar44 = auVar35._0_8_;
          bVar11 = bVar12;
          if ((this->stepadjust_threshold < dVar44) || (dVar44 < 1.0 / this->stepadjust_threshold))
          {
            H._0_16_ = ZEXT816(0);
            pp_Var19 = (_func_int **)std::chrono::_V2::system_clock::now();
            H._vptr_SparseMatrix = pp_Var19;
            for (lVar23 = 0; lVar23 < nc; lVar23 = lVar23 + 1) {
              local_478 = *val;
              pSVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                   &vrho,lVar23);
              dVar1 = *pSVar15;
              pSVar16 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                                  (&((this->LS_solver).
                                     super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->m_mat,nv + lVar23,nv + lVar23);
              *pSVar16 = dVar1 + local_478 + *pSVar16;
            }
            rho_i = dVar44 * rho_i;
            Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
                      ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vrho,&rho_i);
            iVar13 = 0;
            uVar21 = 0;
            while( true ) {
              ppCVar6 = (sysd->vconstraints).
                        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(sysd->vconstraints).
                                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6 >> 3) <=
                  (ulong)uVar21) break;
              pCVar7 = ppCVar6[uVar21];
              if (pCVar7->active == true) {
                if (pCVar7->mode == CONSTRAINT_LOCK) {
                  local_478 = this->rho_b;
                  pSVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                            operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *
                                       )&vrho,(long)iVar13);
                  *pSVar15 = local_478;
                }
                iVar13 = iVar13 + 1;
              }
              uVar21 = uVar21 + 1;
            }
            for (lVar23 = 0; lVar23 < nc; lVar23 = lVar23 + 1) {
              local_478 = *val;
              pSVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                   &vrho,lVar23);
              dVar44 = *pSVar15;
              pSVar16 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                                  (&((this->LS_solver).
                                     super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->m_mat,nv + lVar23,nv + lVar23);
              *pSVar16 = *pSVar16 - (dVar44 + local_478);
            }
            (*(((this->LS_solver).
                super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_ChSolverLS).super_ChSolver._vptr_ChSolver[10])();
            ChTimer<double>::stop((ChTimer<double> *)&H);
            if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
              pCVar17 = GetLog();
              pCVar18 = ChStreamOutAscii::operator<<
                                  (&pCVar17->super_ChStreamOutAscii," Time for re-factorize : << ");
              dVar44 = ChTimer<double>::GetTimeSecondsIntermediate((ChTimer<double> *)&H);
              pCVar18 = ChStreamOutAscii::operator<<(pCVar18,dVar44);
              ChStreamOutAscii::operator<<(pCVar18,"s\n");
            }
          }
        }
      }
      else {
        if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
          pCVar17 = GetLog();
          pCVar18 = ChStreamOutAscii::operator<<
                              (&pCVar17->super_ChStreamOutAscii,"ADMMfast converged ok! at iter=");
          pCVar18 = ChStreamOutAscii::operator<<(pCVar18,uVar22);
          ChStreamOutAscii::operator<<(pCVar18,"\n");
        }
        bVar11 = false;
      }
      Eigen::internal::handmade_aligned_free
                (ckkt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      uVar22 = uVar22 + 1;
    } while (bVar11);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&l,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              (&l,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)&H);
    (*sysd->_vptr_ChSystemDescriptor[0x13])(sysd,&l);
    (*sysd->_vptr_ChSystemDescriptor[0x11])(sysd,&v);
    local_458 = this->r_dual;
    ChSparsityPatternLearner::~ChSparsityPatternLearner(&sparsity_pattern);
    Eigen::internal::handmade_aligned_free
              (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
    ;
    Eigen::internal::handmade_aligned_free
              (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
    Eigen::internal::handmade_aligned_free
              (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              );
    Eigen::internal::handmade_aligned_free
              (y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              );
    Eigen::internal::handmade_aligned_free
              (z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              );
    Eigen::internal::handmade_aligned_free
              (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              );
    Eigen::internal::handmade_aligned_free
              (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix(&A);
    Eigen::internal::handmade_aligned_free
              (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix(&E);
    Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix(&Cq);
  }
  Eigen::internal::handmade_aligned_free
            (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return local_458;
}

Assistant:

double ChSolverADMM::_SolveFast(ChSystemDescriptor& sysd) {

    // For Nesterov:
    double nalpha = 1.0; 
    double c_k = 1e10;
    double eta = 0.9999;

    ChTimer<> m_timer_convert;
    ChTimer<> m_timer_factorize;
    ChTimer<> m_timer_solve;

    double rho_i = this->rho;

    std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();

    int nc = sysd.CountActiveConstraints();
    int nv = sysd.CountActiveVariables();

    ChVectorDynamic<> v(nv);

    // shortcut for the case of no constraints:
    if (nc == 0) {

        ChSparseMatrix H(nv, nv);
        ChVectorDynamic<> k(nv);


        m_timer_convert.start();

        ChSparsityPatternLearner sparsity_pattern(nv, nv);
        sysd.ConvertToMatrixForm(&sparsity_pattern, 0); 
        sparsity_pattern.Apply(H);
        sysd.ConvertToMatrixForm(&H,&k);  
        LS_solver->A() = H; 
        LS_solver->b() = k; 

        m_timer_convert.stop();
        if (this->verbose) GetLog() << " Time for ConvertToMatrixForm: << " << m_timer_convert.GetTimeSecondsIntermediate() << "s\n";

        // v = H\k
        LS_solver->SetupCurrent();
        LS_solver->SolveCurrent();

        //v = LS_solver->x();
        sysd.FromVectorToVariables(LS_solver->x());

        return 0;
    }
        
    ChSparseMatrix Cq(nc,nv);
    ChSparseMatrix E(nc,nc);
    ChVectorDynamic<> k(nv);
    ChVectorDynamic<> b(nc);

    ChSparseMatrix    A(nv+nc,nv+nc);
    ChVectorDynamic<> B(nv+nc);

    ChVectorDynamic<> l(nc);
    ChVectorDynamic<> z(nc);
    ChVectorDynamic<> y(nc);

    ChVectorDynamic<> l_old(nc);
    ChVectorDynamic<> z_old(nc);
    ChVectorDynamic<> y_old(nc);
    ChVectorDynamic<> v_old(nv);
    
    sysd.ConvertToMatrixForm(&Cq, 0, &E, &k, &b, 0);
    Cq.makeCompressed();
    E.makeCompressed();

    if (!this->m_warm_start) {
        l.setZero();
        z.setZero();
        y.setZero();

        //***TODO**? or just accept approximation?
        //v = M\(k + D*l); % PERFORMANCE HIT, only needed if truncating Nesterov before convergence
        v.setZero(); // enough approx? or better sysd.FromVariablesToVector(v, false); ?
    }
    else
    {
        // warmstarted l:
        sysd.FromConstraintsToVector(l, false);

        // warmstarted v:
        //v = H\(k + D*l); // PERFORMANCE HIT, probably better reuse last v if possible..
        sysd.FromVariablesToVector(v, false); // this works supposing that variables have been warmstarted with "v" too, otherwise:  

        // warmstarted y:
        // the following correct only if r_dual was approx.=0. //***TODO*** as parameter
        y = - (Cq*v - E*l + b); //  dual residual exploiting the kkt form instead of - (N*l+r), faster!
            
        /*
        GetLog() << "Y warmastarted:  \n";
        for (int k = 0; k < ChMin(y.rows(), 10); ++k)
            GetLog() << "  " << y(k) << "\n";
        */
        
        // warmstarted z:
        z = l; //  warm start also this - should project? //***TODO*** as parameter
        //sysd.ConstraintsProject(z);

    }

    ChVectorDynamic<> S(nc);

    if (this->precond == true) {
        // Compute diagonal values of N , only mass effect, neglecting stiffness for the moment, TODO
        //  g_i=[Cq_i]*[invM_i]*[Cq_i]' 
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            mconstraints[ic]->Update_auxiliary();

        // Average all g_i for the triplet of contact constraints n,u,v.
        int j_friction_comp = 0;
        double gi_values[3];
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
            if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
                gi_values[j_friction_comp] = mconstraints[ic]->Get_g_i();
                j_friction_comp++;
                if (j_friction_comp == 3) {
                    double average_g_i = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
                    mconstraints[ic - 2]->Set_g_i(average_g_i);
                    mconstraints[ic - 1]->Set_g_i(average_g_i);
                    mconstraints[ic - 0]->Set_g_i(average_g_i);
                    j_friction_comp = 0;
                }
            }
        }
        // The vector with the diagonal of the N matrix
        S.setZero();
        int d_i = 0;
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            if (mconstraints[ic]->IsActive()) {
                S(d_i, 0) = sqrt(mconstraints[ic]->Get_g_i());  // square root of diagonal of N, just mass matrices considered, no stiffness matrices anyway
                ++d_i;
            }
        // Now we should scale Cq, E, b as
        // Cq = Cq*diag(S);
        // E = diag(S)*E*diag(S);
        
        // but to avoid storing Cq and E and assembly in A, we postpone this by scaling the entire A matrix later via a IS*A*IS operation
        
        // b = diag(S)*b;
        b = b.cwiseProduct(S);

        // warm started values must be scaled too
        l = l.cwiseQuotient(S); // from l to \breve{l}
        z = z.cwiseQuotient(S); 
        y = y.cwiseProduct(S);

    }
    else {
        S.setConstant(1);
    }  

    // vsigma = ones(nconstr,1)*sigma;
    ChVectorDynamic<> vsigma(nc); // not needed
    vsigma.setConstant(this->sigma);
    

    // vrho = ones(nconstr,1)*rho;
    ChVectorDynamic<> vrho(nc);
    vrho.setConstant(rho_i);

    // vrho(fric==-2) = rho_b;          // special step for bilateral joints
    int s_c = 0;
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->IsActive()) {
            if (mconstraints[ic]->GetMode()==eChConstraintMode::CONSTRAINT_LOCK)
                vrho(s_c) = rho_b;
            s_c++;
        }
    }
 
    // FACTORIZATION
    //
    // A = [M, Cq'; Cq, -diag(vsigma+vrho) + E ];

    
    m_timer_convert.start();

    LS_solver->A().resize(nv + nc, nv + nc); // otherwise conservativeResize in ConvertToMatrixForm() causes error

    //sysd.ConvertToMatrixForm(&LS_solver->A(),&LS_solver->b());  // A = [M, Cq'; Cq, E ];
    // much faster to fill brand new sparse matrices??!!
    ChSparsityPatternLearner sparsity_pattern(nv + nc, nv + nc);
    sysd.ConvertToMatrixForm(&sparsity_pattern, nullptr);
    sparsity_pattern.Apply(A);

    sysd.ConvertToMatrixForm(&A,&B);  // A = [M, Cq'; Cq, E ]; 

    if (this->precond) {
        // the following is equivalent to having scaled 
        // Cq = Cq*diag(S);
        // E = diag(S)*E*diag(S);
        ChVectorDynamic<> IS(nv + nc);
        IS << Eigen::VectorXd::Ones(nv) , S;
        A = IS.asDiagonal() * A * IS.asDiagonal();
        B = IS.asDiagonal() * B; // not needed? B here only factorization...
    }

    LS_solver->A() = A; 
    LS_solver->b() = B; 

    for (int i = 0; i < nc; ++i)
        LS_solver->A().coeffRef(nv + i, nv + i) += -(sigma + vrho(i));  //  A = [M, Cq'; Cq, -diag(vsigma+vrho) + E ];

    m_timer_convert.stop();
    if (this->verbose) GetLog() << " Time for ConvertToMatrixForm: << " << m_timer_convert.GetTimeSecondsIntermediate() << "s\n";

    m_timer_factorize.start();
                
    LS_solver->SetupCurrent();  // LU decomposition ++++++++++++++++++++++++++++++++++++++

    m_timer_factorize.stop();
    if (this->verbose) GetLog() << " Time for factorize : << " << m_timer_factorize.GetTimeSecondsIntermediate() << "s\n";

    /*
    res_story.r_prim=zeros(1,1);
    res_story.r_dual_Nlry=zeros(1,1);
    res_story.r_dual=zeros(1,1);
    res_story.r_combined_pre=zeros(1,1);
    res_story.r_combined=zeros(1,1);
    res_story.r_deltal=zeros(1,1);
    res_story.r_rho=zeros(1,1);
    res_story.r_violation=zeros(1,1);
    */

    for (int iter = 0; iter < m_max_iterations; iter++) {

        // diagnostic
        l_old = l;
        z_old = z;
        y_old = y;
        v_old = v;

        // Z  u

        // z = project_orthogonal( l + y./vrho,  fric);
        z = l + y.cwiseQuotient(vrho);
        sysd.ConstraintsProject(z); 


        // X   (lambda)

        // SOLVE LINEAR SYSTEM HERE
        // ckkt = -bkkt + (vsigma+vrho).*z - y;
        
        ChVectorDynamic<> ckkt = -b + (vsigma + vrho).cwiseProduct(z) - y;
        LS_solver->b() << k, ckkt;         // B = [k;ckkt];
        
        m_timer_solve.start();

        LS_solver->SolveCurrent();                                                      // LU forward/backsolve ++++++++++++++++++++++++++++++++++++++
        
        m_timer_solve.stop();
        if (this->verbose) GetLog() << " Time for solve : << " << m_timer_solve.GetTimeSecondsIntermediate() << "s\n";

        // x = dA\B;      // A* x = B  with x = [v, -l]    
        l = -LS_solver->x().block(nv, 0, nc, 1);
        v =  LS_solver->x().block(0, 0, nv, 1);
        

        // Y

        y = y + vrho.asDiagonal() * (l - z); 


        // Compute residuals for tolerances
        /*
        r_prim         = norm((z-l).*S, inf);
        r_prim_pre     = norm((z-l)   , inf); 
        r_dual_Nlry    = norm((D'*v-E*l+bkkt+y)./S,inf); % dual residual exploiting the kkt form instead of (N*l+r+y)./S, faster!
        r_dual_Nlry_pre= norm((D'*v-E*l+bkkt+y)   ,inf); % note: does not coincide with r_dual as in plain ADMM, discover why
        r_dual         = norm((vrho.*(l-l_old))./S,inf); % for order is Z-X-Y , different than in plain ADMM X-Z-Y - BUT NOT AFTER NESTEROV CORRECTION!
        r_dual_pre     = norm((vrho.*(l-l_old))   ,inf);
        r_combined     = norm((z-l).*S, 2) +  norm((l-l_old).*S, 2); % combined res. in original metric
        r_combined_pre = norm((z-l)   , 2) +  norm((l-l_old)    ,2); % combined res. in precond.metric
        */
        r_prim = ((z - l).cwiseProduct(S)).lpNorm<Eigen::Infinity>();     //r_prim     = norm((z - l).*S, inf);   
        double r_prim_pre = (z - l).lpNorm<Eigen::Infinity>();              //r_prim_pre = norm((z - l)   , inf); 

        r_dual = (((l - l_old).cwiseProduct(vrho)).cwiseQuotient(S)).lpNorm<Eigen::Infinity>(); // r_dual = norm((vrho.*(l - l_old)). / S, inf); % even faster!See book of Boyd.But coincides only for alpha = 1 !!!
        double r_dual_pre = ((l - l_old).cwiseProduct(vrho)).lpNorm<Eigen::Infinity>();  // r_dual_pre     = norm((vrho.*(l - l_old))   ,inf); 

        //r_combined = norm((z - l).*S, 2) + norm((l - l_old). / S, 2);% combined res.in original metric
        //r_combined_pre = norm((z - l), 2) + norm((l - l_old), 2);% combined res.in precond.metric



        if (this->verbose)
            GetLog() << "ADMMfast iter=" << iter << " prim=" << r_prim << " dual=" << r_dual << "  rho=" << rho_i << " alpha=" << nalpha << "  tols=" << this->tol_prim << " " << this->tol_dual <<  "\n";

        // For recording into violation history, if debugging
        if (this->record_violation_history) {
            // combined residual 
            //double r_combined = ((z - l).cwiseProduct(S)).norm() + ((l - l_old).cwiseQuotient(S)).norm();
            //double r_combined_pre = (z - l).norm() + (l - l_old).norm(); //combined res.in precond.metric
            double c_k_p = (1 / rho) * (y - y_old).norm() + rho * (l - l_old).norm();
            AtIterationEnd(c_k_p, (l - l_old).norm(), iter);
        }
        
        // Termination:
        if ((r_prim < this->tol_prim) && (r_dual < this->tol_dual)) {
            if (this->verbose)
                GetLog() << "ADMMfast converged ok! at iter=" << iter << "\n";
            break;
        }

        // Nesterov acceleration
        if (iter > 1) {
            double c_k_p = (1 / rho) * (y - y_old).norm() + rho * (l - l_old).norm();
            if (c_k_p < eta * c_k) {
                double nalpha_p = (1.0 + sqrt(1.0 + 4 * pow(nalpha,2))) / (2.0);
                l = l + ((nalpha - 1.0) / (nalpha_p)) * (l - l_old);
                v = v + ((nalpha - 1.0) / (nalpha_p)) * (v - v_old); // trick to avoid recomputing it at the end
                y = y + ((nalpha - 1.0) / (nalpha_p)) * (y - y_old);
                nalpha = nalpha_p;
                c_k = c_k_p;
            }
            else{
                if (this->verbose) GetLog() << "ADMMfast Nesterov restart." << iter << "\n";
                nalpha = 1.0;
                c_k = (1 / eta) * c_k_p;
            }
        }


        // once in a while update the rho step parameter
        if ((iter % this->stepadjust_each) == 0) {

            double rhofactor = 1; // default do not shrink / enlarge

            if (this->stepadjust_type == AdmmStepType::NONE) {
                rhofactor = 1.;
            }

            if (this->stepadjust_type == AdmmStepType::BALANCED_UNSCALED) {
                rhofactor = sqrt(r_prim_pre / r_dual_pre);
            }

            if (this->stepadjust_type == AdmmStepType::BALANCED_FAST) {
                double r_prim_scaled = r_prim_pre / (ChMax(z.lpNorm<Eigen::Infinity>(), l.lpNorm<Eigen::Infinity>()) + 1e-10); // maybe norm(l, inf) very similar to norm(z, inf)
                double r_dual_scaled = r_dual_pre / (y.lpNorm<Eigen::Infinity>() + 1e-10);  //  as in "ADMM Penalty Parameter Selection by Residual Balancing", Brendt Wohlberg
                rhofactor = sqrt(r_prim_scaled / (r_dual_scaled + 1e-10));
            }

            if (this->stepadjust_type == AdmmStepType::BALANCED_RANGE) {
                double r_prim_scaled = r_prim / this->tol_prim;
                double r_dual_scaled = r_dual / this->tol_dual;
                rhofactor = sqrt(r_prim_scaled / (r_dual_scaled + 1e-10));
            }


            // safeguards against extreme shrinking
            if (rhofactor < 1.0 / this->stepadjust_maxfactor) {
                rhofactor = 1.0 / this->stepadjust_maxfactor;
            }
            if (rhofactor > this->stepadjust_maxfactor) {
                rhofactor = this->stepadjust_maxfactor;
            }

            if ((rhofactor > this->stepadjust_threshold) || (rhofactor < 1.0 / this->stepadjust_threshold)) {

                ChTimer<> m_timer_refactorize;
                m_timer_refactorize.start();

                // Avoid rebuilding all sparse matrix: 
                // A) just remove old rho with -= :
                for (int i = 0; i < nc; ++i)
                    LS_solver->A().coeffRef(nv + i, nv + i) -= -(sigma + vrho(i));  

                // Update rho
                rho_i = rho_i * rhofactor;

                // vrho(fric == -2) = rho_b; //  special step for bilateral joints
                vrho.setConstant(rho_i);
                s_c = 0;
                for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
                    if (mconstraints[ic]->IsActive()) {
                        if (mconstraints[ic]->GetMode()==eChConstraintMode::CONSTRAINT_LOCK)
                            vrho(s_c) = rho_b;
                        s_c++;
                    }
                }

                // UPDATE FACTORIZATION
                //
                //  A = [M, Cq'; Cq, -diag(vsigma+vrho) + E ];
                //
                // To avoid rebuilding A, we just removed the rho step from the diagonal in A), and now: 
                // B) add old rho with += :
                for (int i = 0; i < nc; ++i)
                    LS_solver->A().coeffRef(nv + i, nv + i) += -(sigma + vrho(i));  

                LS_solver->SetupCurrent();  // LU decomposition ++++++++++++++++++++++++++++++++++++++

                m_timer_refactorize.stop();
                if (this->verbose) GetLog() << " Time for re-factorize : << " << m_timer_refactorize.GetTimeSecondsIntermediate() << "s\n";
            }

        } // end step adjust


    } // end iteration

    l = l.cwiseProduct(S);

    /*
    GetLog() << "Y resulting:  \n";
        for (int k = 0; k < ChMin(y.rows(), 10); ++k)
            GetLog() << "  " << y(k) << "\n";
    */

    sysd.FromVectorToConstraints(l);
    sysd.FromVectorToVariables(v);

    return r_dual;
}